

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__vertical_gather_with_8_coeffs
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float *pfVar130;
  float *pfVar131;
  float *pfVar132;
  float *pfVar133;
  float *pfVar134;
  float *pfVar135;
  float *pfVar136;
  float *pfVar137;
  long lVar138;
  long lVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  
  pfVar130 = *inputs;
  pfVar134 = inputs[1];
  fVar140 = (float)*(undefined8 *)vertical_coefficients;
  fVar141 = (float)((ulong)*(undefined8 *)vertical_coefficients >> 0x20);
  fVar142 = (float)*(undefined8 *)(vertical_coefficients + 2);
  fVar143 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 2) >> 0x20);
  fVar144 = (float)*(undefined8 *)(vertical_coefficients + 4);
  fVar145 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 4) >> 0x20);
  fVar146 = (float)*(undefined8 *)(vertical_coefficients + 6);
  fVar147 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 6) >> 0x20);
  pfVar133 = inputs[2];
  pfVar135 = inputs[3];
  pfVar136 = inputs[4];
  pfVar137 = inputs[5];
  pfVar132 = inputs[6];
  pfVar131 = inputs[7];
  lVar138 = (long)input0_end - (long)pfVar130;
  if (0x3f < lVar138) {
    lVar139 = 0;
    do {
      pfVar1 = (float *)((long)pfVar130 + lVar139);
      fVar10 = pfVar1[1];
      fVar11 = pfVar1[2];
      fVar12 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar130 + lVar139 + 0x10);
      fVar13 = *pfVar2;
      fVar14 = pfVar2[1];
      fVar15 = pfVar2[2];
      fVar16 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar130 + lVar139 + 0x20);
      fVar17 = *pfVar2;
      fVar18 = pfVar2[1];
      fVar19 = pfVar2[2];
      fVar20 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar130 + lVar139 + 0x30);
      fVar21 = *pfVar2;
      fVar22 = pfVar2[1];
      fVar23 = pfVar2[2];
      fVar24 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar134 + lVar139);
      fVar25 = pfVar2[1];
      fVar26 = pfVar2[2];
      fVar27 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar134 + lVar139 + 0x10);
      fVar28 = *pfVar3;
      fVar29 = pfVar3[1];
      fVar30 = pfVar3[2];
      fVar31 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar134 + lVar139 + 0x20);
      fVar32 = *pfVar3;
      fVar33 = pfVar3[1];
      fVar34 = pfVar3[2];
      fVar35 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar134 + lVar139 + 0x30);
      fVar36 = *pfVar3;
      fVar37 = pfVar3[1];
      fVar38 = pfVar3[2];
      fVar39 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar133 + lVar139);
      fVar40 = pfVar3[1];
      fVar41 = pfVar3[2];
      fVar42 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar133 + lVar139 + 0x10);
      fVar43 = *pfVar4;
      fVar44 = pfVar4[1];
      fVar45 = pfVar4[2];
      fVar46 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar133 + lVar139 + 0x20);
      fVar47 = *pfVar4;
      fVar48 = pfVar4[1];
      fVar49 = pfVar4[2];
      fVar50 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar133 + lVar139 + 0x30);
      fVar51 = *pfVar4;
      fVar52 = pfVar4[1];
      fVar53 = pfVar4[2];
      fVar54 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar135 + lVar139);
      fVar55 = pfVar4[1];
      fVar56 = pfVar4[2];
      fVar57 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar135 + lVar139 + 0x10);
      fVar58 = *pfVar5;
      fVar59 = pfVar5[1];
      fVar60 = pfVar5[2];
      fVar61 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar135 + lVar139 + 0x20);
      fVar62 = *pfVar5;
      fVar63 = pfVar5[1];
      fVar64 = pfVar5[2];
      fVar65 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar135 + lVar139 + 0x30);
      fVar66 = *pfVar5;
      fVar67 = pfVar5[1];
      fVar68 = pfVar5[2];
      fVar69 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar136 + lVar139);
      fVar70 = pfVar5[1];
      fVar71 = pfVar5[2];
      fVar72 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar136 + lVar139 + 0x10);
      fVar73 = *pfVar6;
      fVar74 = pfVar6[1];
      fVar75 = pfVar6[2];
      fVar76 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar136 + lVar139 + 0x20);
      fVar77 = *pfVar6;
      fVar78 = pfVar6[1];
      fVar79 = pfVar6[2];
      fVar80 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar136 + lVar139 + 0x30);
      fVar81 = *pfVar6;
      fVar82 = pfVar6[1];
      fVar83 = pfVar6[2];
      fVar84 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar137 + lVar139);
      fVar85 = pfVar6[1];
      fVar86 = pfVar6[2];
      fVar87 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar137 + lVar139 + 0x10);
      fVar88 = *pfVar7;
      fVar89 = pfVar7[1];
      fVar90 = pfVar7[2];
      fVar91 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar137 + lVar139 + 0x20);
      fVar92 = *pfVar7;
      fVar93 = pfVar7[1];
      fVar94 = pfVar7[2];
      fVar95 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar137 + lVar139 + 0x30);
      fVar96 = *pfVar7;
      fVar97 = pfVar7[1];
      fVar98 = pfVar7[2];
      fVar99 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar132 + lVar139);
      fVar100 = pfVar7[1];
      fVar101 = pfVar7[2];
      fVar102 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar132 + lVar139 + 0x10);
      fVar103 = *pfVar8;
      fVar104 = pfVar8[1];
      fVar105 = pfVar8[2];
      fVar106 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar132 + lVar139 + 0x20);
      fVar107 = *pfVar8;
      fVar108 = pfVar8[1];
      fVar109 = pfVar8[2];
      fVar110 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar132 + lVar139 + 0x30);
      fVar111 = *pfVar8;
      fVar112 = pfVar8[1];
      fVar113 = pfVar8[2];
      fVar114 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar131 + lVar139);
      fVar115 = pfVar8[1];
      fVar116 = pfVar8[2];
      fVar117 = pfVar8[3];
      pfVar9 = (float *)((long)pfVar131 + lVar139 + 0x10);
      fVar118 = *pfVar9;
      fVar119 = pfVar9[1];
      fVar120 = pfVar9[2];
      fVar121 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar131 + lVar139 + 0x20);
      fVar122 = *pfVar9;
      fVar123 = pfVar9[1];
      fVar124 = pfVar9[2];
      fVar125 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar131 + lVar139 + 0x30);
      fVar126 = *pfVar9;
      fVar127 = pfVar9[1];
      fVar128 = pfVar9[2];
      fVar129 = pfVar9[3];
      pfVar9 = (float *)((long)outputp + lVar139);
      *pfVar9 = *pfVar8 * fVar147 +
                *pfVar7 * fVar146 +
                *pfVar6 * fVar145 +
                *pfVar5 * fVar144 +
                *pfVar4 * fVar143 + *pfVar3 * fVar142 + *pfVar2 * fVar141 + *pfVar1 * fVar140;
      pfVar9[1] = fVar115 * fVar147 +
                  fVar100 * fVar146 +
                  fVar85 * fVar145 +
                  fVar70 * fVar144 +
                  fVar55 * fVar143 + fVar40 * fVar142 + fVar25 * fVar141 + fVar10 * fVar140;
      pfVar9[2] = fVar116 * fVar147 +
                  fVar101 * fVar146 +
                  fVar86 * fVar145 +
                  fVar71 * fVar144 +
                  fVar56 * fVar143 + fVar41 * fVar142 + fVar26 * fVar141 + fVar11 * fVar140;
      pfVar9[3] = fVar117 * fVar147 +
                  fVar102 * fVar146 +
                  fVar87 * fVar145 +
                  fVar72 * fVar144 +
                  fVar57 * fVar143 + fVar42 * fVar142 + fVar27 * fVar141 + fVar12 * fVar140;
      pfVar1 = (float *)((long)outputp + lVar139 + 0x10);
      *pfVar1 = fVar118 * fVar147 +
                fVar103 * fVar146 +
                fVar88 * fVar145 +
                fVar73 * fVar144 +
                fVar58 * fVar143 + fVar43 * fVar142 + fVar28 * fVar141 + fVar13 * fVar140;
      pfVar1[1] = fVar119 * fVar147 +
                  fVar104 * fVar146 +
                  fVar89 * fVar145 +
                  fVar74 * fVar144 +
                  fVar59 * fVar143 + fVar44 * fVar142 + fVar29 * fVar141 + fVar14 * fVar140;
      pfVar1[2] = fVar120 * fVar147 +
                  fVar105 * fVar146 +
                  fVar90 * fVar145 +
                  fVar75 * fVar144 +
                  fVar60 * fVar143 + fVar45 * fVar142 + fVar30 * fVar141 + fVar15 * fVar140;
      pfVar1[3] = fVar121 * fVar147 +
                  fVar106 * fVar146 +
                  fVar91 * fVar145 +
                  fVar76 * fVar144 +
                  fVar61 * fVar143 + fVar46 * fVar142 + fVar31 * fVar141 + fVar16 * fVar140;
      pfVar1 = (float *)((long)outputp + lVar139 + 0x20);
      *pfVar1 = fVar122 * fVar147 +
                fVar107 * fVar146 +
                fVar92 * fVar145 +
                fVar77 * fVar144 +
                fVar62 * fVar143 + fVar47 * fVar142 + fVar32 * fVar141 + fVar17 * fVar140;
      pfVar1[1] = fVar123 * fVar147 +
                  fVar108 * fVar146 +
                  fVar93 * fVar145 +
                  fVar78 * fVar144 +
                  fVar63 * fVar143 + fVar48 * fVar142 + fVar33 * fVar141 + fVar18 * fVar140;
      pfVar1[2] = fVar124 * fVar147 +
                  fVar109 * fVar146 +
                  fVar94 * fVar145 +
                  fVar79 * fVar144 +
                  fVar64 * fVar143 + fVar49 * fVar142 + fVar34 * fVar141 + fVar19 * fVar140;
      pfVar1[3] = fVar125 * fVar147 +
                  fVar110 * fVar146 +
                  fVar95 * fVar145 +
                  fVar80 * fVar144 +
                  fVar65 * fVar143 + fVar50 * fVar142 + fVar35 * fVar141 + fVar20 * fVar140;
      pfVar1 = (float *)((long)outputp + lVar139 + 0x30);
      *pfVar1 = fVar126 * fVar147 +
                fVar111 * fVar146 +
                fVar96 * fVar145 +
                fVar81 * fVar144 +
                fVar66 * fVar143 + fVar51 * fVar142 + fVar36 * fVar141 + fVar21 * fVar140;
      pfVar1[1] = fVar127 * fVar147 +
                  fVar112 * fVar146 +
                  fVar97 * fVar145 +
                  fVar82 * fVar144 +
                  fVar67 * fVar143 + fVar52 * fVar142 + fVar37 * fVar141 + fVar22 * fVar140;
      pfVar1[2] = fVar128 * fVar147 +
                  fVar113 * fVar146 +
                  fVar98 * fVar145 +
                  fVar83 * fVar144 +
                  fVar68 * fVar143 + fVar53 * fVar142 + fVar38 * fVar141 + fVar23 * fVar140;
      pfVar1[3] = fVar129 * fVar147 +
                  fVar114 * fVar146 +
                  fVar99 * fVar145 +
                  fVar84 * fVar144 +
                  fVar69 * fVar143 + fVar54 * fVar142 + fVar39 * fVar141 + fVar24 * fVar140;
      lVar139 = lVar139 + 0x40;
      lVar138 = lVar138 + -0x40;
    } while (0x3f < lVar138);
    outputp = (float *)((long)outputp + lVar139);
    pfVar130 = (float *)((long)pfVar130 + lVar139);
    pfVar134 = (float *)((long)pfVar134 + lVar139);
    pfVar133 = (float *)((long)pfVar133 + lVar139);
    pfVar135 = (float *)((long)pfVar135 + lVar139);
    pfVar136 = (float *)((long)pfVar136 + lVar139);
    pfVar137 = (float *)((long)pfVar137 + lVar139);
    pfVar132 = (float *)((long)pfVar132 + lVar139);
    pfVar131 = (float *)((long)pfVar131 + lVar139);
  }
  if (0xf < lVar138) {
    lVar139 = (long)input0_end - (long)pfVar130;
    lVar138 = 0;
    do {
      pfVar1 = (float *)((long)pfVar130 + lVar138);
      fVar10 = pfVar1[1];
      fVar11 = pfVar1[2];
      fVar12 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar134 + lVar138);
      fVar13 = pfVar2[1];
      fVar14 = pfVar2[2];
      fVar15 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar133 + lVar138);
      fVar16 = pfVar3[1];
      fVar17 = pfVar3[2];
      fVar18 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar135 + lVar138);
      fVar19 = pfVar4[1];
      fVar20 = pfVar4[2];
      fVar21 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar136 + lVar138);
      fVar22 = pfVar5[1];
      fVar23 = pfVar5[2];
      fVar24 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar137 + lVar138);
      fVar25 = pfVar6[1];
      fVar26 = pfVar6[2];
      fVar27 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar132 + lVar138);
      fVar28 = pfVar7[1];
      fVar29 = pfVar7[2];
      fVar30 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar131 + lVar138);
      fVar31 = pfVar8[1];
      fVar32 = pfVar8[2];
      fVar33 = pfVar8[3];
      pfVar9 = (float *)((long)outputp + lVar138);
      *pfVar9 = *pfVar8 * fVar147 +
                *pfVar7 * fVar146 +
                *pfVar6 * fVar145 +
                *pfVar5 * fVar144 +
                *pfVar4 * fVar143 + *pfVar3 * fVar142 + *pfVar2 * fVar141 + *pfVar1 * fVar140;
      pfVar9[1] = fVar31 * fVar147 +
                  fVar28 * fVar146 +
                  fVar25 * fVar145 +
                  fVar22 * fVar144 +
                  fVar19 * fVar143 + fVar16 * fVar142 + fVar13 * fVar141 + fVar10 * fVar140;
      pfVar9[2] = fVar32 * fVar147 +
                  fVar29 * fVar146 +
                  fVar26 * fVar145 +
                  fVar23 * fVar144 +
                  fVar20 * fVar143 + fVar17 * fVar142 + fVar14 * fVar141 + fVar11 * fVar140;
      pfVar9[3] = fVar33 * fVar147 +
                  fVar30 * fVar146 +
                  fVar27 * fVar145 +
                  fVar24 * fVar144 +
                  fVar21 * fVar143 + fVar18 * fVar142 + fVar15 * fVar141 + fVar12 * fVar140;
      lVar138 = lVar138 + 0x10;
      lVar139 = lVar139 + -0x10;
    } while (0xf < lVar139);
    outputp = (float *)((long)outputp + lVar138);
    pfVar130 = (float *)((long)pfVar130 + lVar138);
    pfVar134 = (float *)((long)pfVar134 + lVar138);
    pfVar133 = (float *)((long)pfVar133 + lVar138);
    pfVar135 = (float *)((long)pfVar135 + lVar138);
    pfVar136 = (float *)((long)pfVar136 + lVar138);
    pfVar137 = (float *)((long)pfVar137 + lVar138);
    pfVar132 = (float *)((long)pfVar132 + lVar138);
    pfVar131 = (float *)((long)pfVar131 + lVar138);
  }
  if (pfVar130 < input0_end) {
    lVar138 = 0;
    do {
      pfVar1 = (float *)((long)pfVar130 + lVar138);
      *(float *)((long)outputp + lVar138) =
           *(float *)((long)pfVar131 + lVar138) * fVar147 +
           *(float *)((long)pfVar137 + lVar138) * fVar145 +
           *(float *)((long)pfVar135 + lVar138) * fVar143 +
           *(float *)((long)pfVar134 + lVar138) * fVar141 + *pfVar1 * fVar140 +
           *(float *)((long)pfVar133 + lVar138) * fVar142 +
           *(float *)((long)pfVar136 + lVar138) * fVar144 +
           *(float *)((long)pfVar132 + lVar138) * fVar146;
      lVar138 = lVar138 + 4;
    } while (pfVar1 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}